

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * __thiscall
CompileLanguageNode::Evaluate
          (string *__return_storage_ptr__,CompileLanguageNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  cmGlobalGenerator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  bool bVar1;
  __type _Var2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  long lVar4;
  char *pcVar5;
  string genName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((context->Language)._M_string_length == 0) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
    std::__cxx11::string::string
              ((string *)&local_a8,
               "$<COMPILE_LANGUAGE:...> may only be used to specify include directories compile definitions, compile options and to evaluate components of the file(GENERATE) command."
               ,(allocator *)&local_68);
    reportError(context,&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  this_00 = context->LG->GlobalGenerator;
  cmGlobalGenerator::GetEnabledLanguages(this_00,&local_48);
  if (((parameters->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start !=
       (parameters->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish) &&
     (_Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish),
     _Var3._M_current ==
     local_48.
     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
     ._M_impl.super__Vector_impl_data._M_finish)) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_88,content);
    std::__cxx11::string::string
              ((string *)&local_a8,"$<COMPILE_LANGUAGE:...> Unknown language.",
               (allocator *)&local_68);
    reportError(context,&local_88,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_88);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    goto LAB_0040c6f1;
  }
  (*this_00->_vptr_cmGlobalGenerator[3])(&local_88,this_00);
  lVar4 = std::__cxx11::string::find((char *)&local_88,0x558051);
  if (lVar4 == -1) {
    lVar4 = std::__cxx11::string::find((char *)&local_88,0x55805f);
    if (lVar4 == -1) {
      lVar4 = std::__cxx11::string::find((char *)&local_88,0x55ae36);
      if (((lVar4 != -1) ||
          (lVar4 = std::__cxx11::string::find((char *)&local_88,0x542a58), lVar4 != -1)) ||
         (lVar4 = std::__cxx11::string::find((char *)&local_88,0x548326), lVar4 != -1))
      goto LAB_0040c75b;
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_a8,content);
      std::__cxx11::string::string
                ((string *)&local_68,"$<COMPILE_LANGUAGE:...> not supported for this generator.",
                 &local_a9);
      reportError(context,&local_a8,&local_68);
      goto LAB_0040c58b;
    }
    if ((dagChecker != (cmGeneratorExpressionDAGChecker *)0x0) &&
       ((bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions(dagChecker), bVar1 ||
        (bVar1 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(dagChecker), bVar1)))
       ) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_a8,content);
      std::__cxx11::string::string
                ((string *)&local_68,
                 "$<COMPILE_LANGUAGE:...> may only be used with COMPILE_OPTIONS with the Xcode generator."
                 ,&local_a9);
      reportError(context,&local_a8,&local_68);
      goto LAB_0040c58b;
    }
LAB_0040c75b:
    __rhs = (parameters->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
    if (__rhs == (parameters->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&context->Language);
    }
    else {
      _Var2 = std::operator==(&context->Language,__rhs);
      pcVar5 = "0";
      if (_Var2) {
        pcVar5 = "1";
      }
      std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar5,(allocator *)&local_a8);
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_a8,content);
    std::__cxx11::string::string
              ((string *)&local_68,
               "$<COMPILE_LANGUAGE:...> may not be used with Visual Studio generators.",&local_a9);
    reportError(context,&local_a8,&local_68);
LAB_0040c58b:
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_a8);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&local_88);
LAB_0040c6f1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    if(context->Language.empty())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> may only be used to specify include "
          "directories compile definitions, compile options and to evaluate "
          "components of the file(GENERATE) command.");
      return std::string();
      }

    std::vector<std::string> enabledLanguages;
    cmGlobalGenerator* gg = context->LG->GetGlobalGenerator();
    gg->GetEnabledLanguages(enabledLanguages);
    if (!parameters.empty() &&
          std::find(enabledLanguages.begin(), enabledLanguages.end(),
                  parameters.front()) == enabledLanguages.end())
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> Unknown language.");
      return std::string();
      }
    std::string genName = gg->GetName();
    if (genName.find("Visual Studio") != std::string::npos)
      {
      reportError(context, content->GetOriginalExpression(),
          "$<COMPILE_LANGUAGE:...> may not be used with Visual Studio "
          "generators.");
      return std::string();
      }
    else if (genName.find("Xcode") != std::string::npos)
      {
      if (dagChecker && (dagChecker->EvaluatingCompileDefinitions()
          || dagChecker->EvaluatingIncludeDirectories()))
        {
        reportError(context, content->GetOriginalExpression(),
            "$<COMPILE_LANGUAGE:...> may only be used with COMPILE_OPTIONS "
            "with the Xcode generator.");
        return std::string();
        }
      }
    else
      {
      if(genName.find("Makefiles") == std::string::npos &&
              genName.find("Ninja") == std::string::npos &&
              genName.find("Watcom WMake") == std::string::npos)
        {
        reportError(context, content->GetOriginalExpression(),
            "$<COMPILE_LANGUAGE:...> not supported for this generator.");
        return std::string();
        }
      }
    if (parameters.empty())
      {
      return context->Language;
      }
    return context->Language == parameters.front() ? "1" : "0";
  }